

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O3

void __thiscall lr_grammar::GrammarLR::adjust_follow(GrammarLR *this,int index)

{
  int *__src;
  int iVar1;
  pointer pvVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __dest;
  int iVar3;
  int *piVar4;
  pointer piVar5;
  ulong uVar6;
  long lVar7;
  vector<int,_std::allocator<int>_> tempFollow;
  vector<int,_std::allocator<int>_> local_40;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&local_40,
             (this->follow).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start +
             (this->not_finally_charIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[index]);
  piVar5 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      if ((this->elements).
          super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>._M_impl.
          super__Vector_impl_data._M_start[*(int *)((long)piVar5 + lVar7)].super_Elem.is_finally ==
          false) {
        pvVar2 = (this->follow).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar1 = (this->not_finally_charIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[index];
        __dest = std::
                 __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            *(pointer *)
                             ((long)&pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data + 8),(long)piVar5 + lVar7);
        pvVar2 = (this->follow).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar1 = (this->not_finally_charIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[index];
        __src = __dest._M_current + 1;
        piVar4 = *(pointer *)
                  ((long)&pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        iVar3 = iVar1;
        if (__src != piVar4) {
          memmove(__dest._M_current,__src,(long)piVar4 - (long)__src);
          piVar4 = *(pointer *)
                    ((long)&pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + 8);
          iVar3 = (this->not_finally_charIndex).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start[index];
        }
        *(int **)((long)&pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 8) = piVar4 + -1;
        piVar5 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (iVar3 != *(int *)((long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar7)) {
          adjust_follow(this,*(int *)((long)local_40.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start + lVar7));
          pvVar2 = (this->follow).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          public_tool::connect_vector
                    (pvVar2 + (this->not_finally_charIndex).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[index],
                     pvVar2 + *(int *)((long)local_40.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start + lVar7));
          piVar5 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 4;
    } while (uVar6 < (ulong)((long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar5 >> 2));
  }
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5);
  }
  return;
}

Assistant:

void GrammarLR::adjust_follow(int index){
    //保存使用
    vector<int> tempFollow = follow[not_finally_charIndex[index]];
    for (int i = 0; i < tempFollow.size(); i++){
        if (!elements[tempFollow[i]].is_finally){
            //在原来的Follow中将这个非终结符删除
            vector<int>::const_iterator deleteIt = find(follow[not_finally_charIndex[index]].begin(), follow[not_finally_charIndex[index]].end(), tempFollow[i]);
            follow[not_finally_charIndex[index]].erase(deleteIt);

            //如果两个是一样的
            if (not_finally_charIndex[index] != tempFollow[i]) {
                adjust_follow(tempFollow[i]);

                public_tool::connect_vector(follow[not_finally_charIndex[index]], follow[tempFollow[i]]);

            }




        }

    }

}